

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O0

Ivy_Obj_t * Ivy_TableLookup(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Ivy_Init_t IVar3;
  Ivy_Init_t IVar4;
  Ivy_Type_t IVar5;
  Ivy_Type_t IVar6;
  Ivy_Obj_t *pIVar7;
  Ivy_Obj_t *pIVar8;
  Ivy_Obj_t *pIVar9;
  uint local_2c;
  int i;
  Ivy_Obj_t *pEntry;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyTable.c"
                  ,0x4b,"Ivy_Obj_t *Ivy_TableLookup(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  iVar1 = Ivy_ObjIsHash(pObj);
  if (iVar1 != 0) {
    iVar1 = Ivy_ObjIsLatch(pObj);
    if ((iVar1 == 0) && (iVar1 = Ivy_ObjFaninId0(pObj), iVar1 < 1)) {
      __assert_fail("Ivy_ObjIsLatch(pObj) || Ivy_ObjFaninId0(pObj) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyTable.c"
                    ,0x4e,"Ivy_Obj_t *Ivy_TableLookup(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    iVar1 = Ivy_ObjFaninId1(pObj);
    if (iVar1 != 0) {
      iVar1 = Ivy_ObjFaninId0(pObj);
      iVar2 = Ivy_ObjFaninId1(pObj);
      if (iVar2 <= iVar1) {
        __assert_fail("Ivy_ObjFaninId1(pObj) == 0 || Ivy_ObjFaninId0(pObj) < Ivy_ObjFaninId1(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyTable.c"
                      ,0x4f,"Ivy_Obj_t *Ivy_TableLookup(Ivy_Man_t *, Ivy_Obj_t *)");
      }
    }
    pIVar7 = Ivy_ObjFanin0(pObj);
    if ((pIVar7->nRefs != 0) &&
       ((pIVar7 = Ivy_ObjChild1(pObj), pIVar7 == (Ivy_Obj_t *)0x0 ||
        (pIVar7 = Ivy_ObjFanin1(pObj), pIVar7->nRefs != 0)))) {
      for (local_2c = Ivy_Hash(pObj,p->nTableSize); p->pTable[(int)local_2c] != 0;
          local_2c = (int)(local_2c + 1) % p->nTableSize) {
        pIVar7 = Ivy_ManObj(p,p->pTable[(int)local_2c]);
        pIVar8 = Ivy_ObjChild0(pIVar7);
        pIVar9 = Ivy_ObjChild0(pObj);
        if (pIVar8 == pIVar9) {
          pIVar8 = Ivy_ObjChild1(pIVar7);
          pIVar9 = Ivy_ObjChild1(pObj);
          if (pIVar8 == pIVar9) {
            IVar3 = Ivy_ObjInit(pIVar7);
            IVar4 = Ivy_ObjInit(pObj);
            if (IVar3 == IVar4) {
              IVar5 = Ivy_ObjType(pIVar7);
              IVar6 = Ivy_ObjType(pObj);
              if (IVar5 == IVar6) {
                return pIVar7;
              }
            }
          }
        }
      }
    }
  }
  return (Ivy_Obj_t *)0x0;
}

Assistant:

Ivy_Obj_t * Ivy_TableLookup( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pEntry;
    int i;
    assert( !Ivy_IsComplement(pObj) );
    if ( !Ivy_ObjIsHash(pObj) )
        return NULL;
    assert( Ivy_ObjIsLatch(pObj) || Ivy_ObjFaninId0(pObj) > 0 );
    assert( Ivy_ObjFaninId1(pObj) == 0 || Ivy_ObjFaninId0(pObj) < Ivy_ObjFaninId1(pObj) );
    if ( Ivy_ObjFanin0(pObj)->nRefs == 0 || (Ivy_ObjChild1(pObj) && Ivy_ObjFanin1(pObj)->nRefs == 0) )
        return NULL;
    for ( i = Ivy_Hash(pObj, p->nTableSize); p->pTable[i]; i = (i+1) % p->nTableSize )
    {
        pEntry = Ivy_ManObj( p, p->pTable[i] );
        if ( Ivy_ObjChild0(pEntry) == Ivy_ObjChild0(pObj) && 
             Ivy_ObjChild1(pEntry) == Ivy_ObjChild1(pObj) && 
             Ivy_ObjInit(pEntry) == Ivy_ObjInit(pObj) && 
             Ivy_ObjType(pEntry) == Ivy_ObjType(pObj) )
            return pEntry;
    }
    return NULL;
}